

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::ConvertToUnixOutputPath(string *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  long lVar2;
  char *local_68;
  char *ch;
  string local_58 [6];
  char lastch;
  string result;
  size_type pos;
  string *path_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  while (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0xa7e6e4),
        uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1);
  }
  lVar2 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0xa41ea5);
  if (lVar2 != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"",(allocator *)((long)&ch + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&ch + 7));
    ch._6_1_ = '\x01';
    for (local_68 = (char *)std::__cxx11::string::c_str(); *local_68 != '\0';
        local_68 = local_68 + 1) {
      if ((*local_68 == ' ') && (ch._6_1_ != '\\')) {
        std::__cxx11::string::operator+=(local_58,'\\');
      }
      std::__cxx11::string::operator+=(local_58,*local_68);
      ch._6_1_ = *local_68;
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::ConvertToUnixOutputPath(const std::string& path)
{
  std::string ret = path;

  // remove // except at the beginning might be a cygwin drive
  std::string::size_type pos = 1;
  while ((pos = ret.find("//", pos)) != std::string::npos) {
    ret.erase(pos, 1);
  }
  // escape spaces and () in the path
  if (ret.find_first_of(" ") != std::string::npos) {
    std::string result = "";
    char lastch = 1;
    for (const char* ch = ret.c_str(); *ch != '\0'; ++ch) {
      // if it is already escaped then don't try to escape it again
      if ((*ch == ' ') && lastch != '\\') {
        result += '\\';
      }
      result += *ch;
      lastch = *ch;
    }
    ret = result;
  }
  return ret;
}